

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product.cpp
# Opt level: O3

AggregateFunction * duckdb::ProductFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  FunctionNullHandling in_R8B;
  LogicalType LStack_38;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffe0,DOUBLE);
  LogicalType::LogicalType(&LStack_38,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::ProductState,double,double,duckdb::ProductFunction,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffe0,&LStack_38,(LogicalType *)0x0,
             in_R8B);
  LogicalType::~LogicalType(&LStack_38);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffe0);
  return in_RDI;
}

Assistant:

AggregateFunction ProductFun::GetFunction() {
	return AggregateFunction::UnaryAggregate<ProductState, double, double, ProductFunction>(
	    LogicalType(LogicalTypeId::DOUBLE), LogicalType::DOUBLE);
}